

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall AtomicHash::xorWith(AtomicHash *this,uint64_t *update)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    LOCK();
    this->hash[lVar1].super___atomic_base<unsigned_long>._M_i =
         this->hash[lVar1].super___atomic_base<unsigned_long>._M_i ^ update[lVar1];
    UNLOCK();
  }
  return;
}

Assistant:

void xorWith(uint64_t update[4]) {
		for (int i = 0; i < 4; ++i)
			hash[i].fetch_xor(update[i]);
	}